

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O0

Result __thiscall wabt::ExprVisitor::VisitExprList(ExprVisitor *this,ExprList *exprs)

{
  bool bVar1;
  Result result;
  reference root_expr;
  iterator rhs;
  Expr *expr;
  iterator __end1;
  iterator __begin1;
  ExprList *__range1;
  ExprList *exprs_local;
  ExprVisitor *this_local;
  
  join_0x00000010_0x00000000_ = intrusive_list<wabt::Expr>::begin(exprs);
  rhs = intrusive_list<wabt::Expr>::end(exprs);
  while( true ) {
    bVar1 = intrusive_list<wabt::Expr>::iterator::operator!=((iterator *)&__end1.node_,rhs);
    if (!bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    root_expr = intrusive_list<wabt::Expr>::iterator::operator*((iterator *)&__end1.node_);
    result = VisitExpr(this,root_expr);
    bVar1 = Failed(result);
    if (bVar1) break;
    intrusive_list<wabt::Expr>::iterator::operator++((iterator *)&__end1.node_);
  }
  Result::Result((Result *)((long)&this_local + 4),Error);
  return (Result)this_local._4_4_;
}

Assistant:

Result ExprVisitor::VisitExprList(ExprList& exprs) {
  for (Expr& expr : exprs)
    CHECK_RESULT(VisitExpr(&expr));
  return Result::Ok;
}